

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::ConfidentialTxIn::GetWitnessHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTxIn *this)

{
  bool bVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ByteData256 empty_data;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  this_00 = &_Stack_78;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = AbstractTxIn::IsCoinBase(&this->super_AbstractTxIn);
  if (bVar1) {
    ByteData::ByteData((ByteData *)&local_28);
    ByteData::Serialize((ByteData *)&local_60,(ByteData *)&local_28);
    HashUtil::Sha256D((ByteData256 *)&_Stack_78,(ByteData *)&local_60);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,(value_type *)&_Stack_78);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,(value_type *)&_Stack_78);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,(value_type *)&_Stack_78);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&local_48,(value_type *)&_Stack_78);
  }
  else {
    ByteData::Serialize((ByteData *)&local_60,&this->issuance_amount_rangeproof_);
    HashUtil::Sha256D((ByteData256 *)&_Stack_78,(ByteData *)&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,(ByteData256 *)&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ByteData::Serialize((ByteData *)&local_60,&this->inflation_keys_rangeproof_);
    HashUtil::Sha256D((ByteData256 *)&_Stack_78,(ByteData *)&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,(ByteData256 *)&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ScriptWitness::Serialize((ByteData *)&local_60,&(this->super_AbstractTxIn).script_witness_);
    HashUtil::Sha256D((ByteData256 *)&_Stack_78,(ByteData *)&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,(ByteData256 *)&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ScriptWitness::Serialize((ByteData *)&local_60,&this->pegin_witness_);
    HashUtil::Sha256D((ByteData256 *)&_Stack_78,(ByteData *)&local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(&local_48,(ByteData256 *)&_Stack_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
    this_00 = &local_60;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
  CryptoUtil::ComputeFastMerkleRoot
            (__return_storage_ptr__,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_48);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_48)
  ;
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTxIn::GetWitnessHash() const {
  std::vector<ByteData256> leaves;
  if (IsCoinBase()) {
    ByteData256 empty_data = HashUtil::Sha256D(ByteData().Serialize());
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
  } else {
    leaves.push_back(
        HashUtil::Sha256D(issuance_amount_rangeproof_.Serialize()));
    leaves.push_back(
        HashUtil::Sha256D(inflation_keys_rangeproof_.Serialize()));
    leaves.push_back(HashUtil::Sha256D(script_witness_.Serialize()));
    leaves.push_back(HashUtil::Sha256D(pegin_witness_.Serialize()));
  }
  ByteData256 result = CryptoUtil::ComputeFastMerkleRoot(leaves);
  return result;
}